

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O3

void __thiscall
xray_re::cse_alife_item_weapon::state_write(cse_alife_item_weapon *this,xr_packet *packet)

{
  cse_alife_dynamic_object_visual::state_write((cse_alife_dynamic_object_visual *)this,packet);
  cse_alife_inventory_item::state_write
            (&(this->super_cse_alife_item).super_cse_alife_inventory_item,packet);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)this->m_ammo_current);
  (*packet->_vptr_xr_packet[8])(packet,(ulong)this->m_ammo_elapsed);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_state);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_addon_flags);
  (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_ammo_type);
  if (0x7a < (this->super_cse_alife_item).super_cse_alife_dynamic_object_visual.
             super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract.m_version) {
    (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_cs_unk1_u8);
    return;
  }
  return;
}

Assistant:

void cse_alife_item_weapon::state_write(xr_packet& packet)
{
	cse_alife_item::state_write(packet);
	packet.w_u16(m_ammo_current);
	packet.w_u16(m_ammo_elapsed);
	packet.w_u8(m_state);
	packet.w_u8(m_addon_flags);
	packet.w_u8(m_ammo_type);
	if (m_version > CSE_VERSION_0x7a)
		packet.w_u8(m_cs_unk1_u8);
}